

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

wchar_t m_cmp_race(void *a,void *b)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  wchar_t wVar4;
  ulong uVar5;
  ulong uVar6;
  wchar_t wVar7;
  
  wVar4 = default_join[*a].gid;
  wVar3 = wVar4 - default_join[*b].gid;
  if (wVar3 == L'\0') {
    if ((wVar4 < L'\0') || (n_monster_group <= wVar4)) {
      __assert_fail("gid >= 0 && gid < n_monster_group",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-knowledge.c"
                    ,0x496,"int m_cmp_race(const void *, const void *)");
    }
    wVar1 = default_join[*a].oid;
    wVar2 = default_join[*b].oid;
    wVar3 = monster_group[(uint)wVar4].n_inc_bases;
    if (wVar3 != L'\0') {
      uVar5 = 0;
      uVar6 = 0;
      wVar7 = wVar3;
      if (L'\0' < wVar3) {
        uVar6 = (ulong)(uint)wVar3;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        if (r_info[wVar1].base == monster_group[(uint)wVar4].inc_bases[uVar5]) {
          wVar3 = (wchar_t)uVar5;
        }
        if (r_info[wVar2].base == monster_group[(uint)wVar4].inc_bases[uVar5]) {
          wVar7 = (wchar_t)uVar5;
        }
      }
      if (wVar3 - wVar7 != L'\0') {
        return wVar3 - wVar7;
      }
    }
    wVar3 = r_info[wVar1].level - r_info[wVar2].level;
    if (wVar3 == L'\0') {
      wVar4 = strcmp(r_info[wVar1].name,r_info[wVar2].name);
      return wVar4;
    }
  }
  return wVar3;
}

Assistant:

static int m_cmp_race(const void *a, const void *b)
{
	const int a_val = *(const int *)a;
	const int b_val = *(const int *)b;
	const struct monster_race *r_a = &r_info[default_item_id(a_val)];
	const struct monster_race *r_b = &r_info[default_item_id(b_val)];
	int gid = default_group_id(a_val);

	/* Group by */
	int c = gid - default_group_id(b_val);
	if (c)
		return c;

	/*
	 * If the group specifies monster bases, order those that are included
	 * by the base by those bases.  Those that aren't in any of the bases
	 * appear last.
	 */
	assert(gid >= 0 && gid < n_monster_group);
	if (monster_group[gid].n_inc_bases) {
		int base_a = monster_group[gid].n_inc_bases;
		int base_b = monster_group[gid].n_inc_bases;
		int i;

		for (i = 0; i < monster_group[gid].n_inc_bases; ++i) {
			if (r_a->base == monster_group[gid].inc_bases[i]) {
				base_a = i;
			}
			if (r_b->base == monster_group[gid].inc_bases[i]) {
				base_b = i;
			}
		}
		c = base_a - base_b;
		if (c) {
			return c;
		}
	}

	/*
	 * Within the same base or outside of a specified base, order by level
	 * and then by name.
	 */
	c = r_a->level - r_b->level;
	if (c)
		return c;

	return strcmp(r_a->name, r_b->name);
}